

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromAPInt
          (IEEEFloat *this,APInt *Val,bool isSigned,roundingMode rounding_mode)

{
  bool bVar1;
  opStatus oVar2;
  uint64_t *src;
  APInt local_58;
  APInt local_48;
  undefined1 local_38 [8];
  APInt api;
  uint partCount;
  roundingMode rounding_mode_local;
  bool isSigned_local;
  APInt *Val_local;
  IEEEFloat *this_local;
  
  api._12_4_ = APInt::getNumWords(Val);
  APInt::APInt((APInt *)local_38,Val);
  this->field_0x12 = this->field_0x12 & 0xf7;
  if ((isSigned) && (bVar1 = APInt::isNegative((APInt *)local_38), bVar1)) {
    this->field_0x12 = this->field_0x12 & 0xf7 | 8;
    APInt::APInt(&local_58,(APInt *)local_38);
    llvm::operator-((llvm *)&local_48,&local_58);
    APInt::operator=((APInt *)local_38,&local_48);
    APInt::~APInt(&local_48);
    APInt::~APInt(&local_58);
  }
  src = APInt::getRawData((APInt *)local_38);
  oVar2 = convertFromUnsignedParts(this,src,api._12_4_,rounding_mode);
  APInt::~APInt((APInt *)local_38);
  return oVar2;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertFromAPInt(const APInt &Val, bool isSigned,
                                                roundingMode rounding_mode) {
  unsigned int partCount = Val.getNumWords();
  APInt api = Val;

  sign = false;
  if (isSigned && api.isNegative()) {
    sign = true;
    api = -api;
  }

  return convertFromUnsignedParts(api.getRawData(), partCount, rounding_mode);
}